

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1M1P<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  pointer ppVar1;
  pointer ppVar2;
  iterator __position;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  PointerType ptr;
  double *pdVar8;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar9;
  ostream *poVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  pointer pMVar14;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar15;
  iterator iVar16;
  double *pdVar17;
  byte bVar18;
  Scalar SVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  double dVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar37;
  double dVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<double,_4,_1,_0,_4,_1> PiU;
  Matrix<double,_6,_1,_0,_6,_1> lU1;
  Matrix<double,_4,_1,_0,_4,_1> NuU;
  Matrix<double,_6,_1,_0,_6,_1> lU2;
  Matrix<double,_4,_1,_0,_4,_1> Pi;
  Matrix<double,_6,_6,_0,_6,_6> TuL1;
  Matrix<double,_4,_1,_0,_4,_1> Nu;
  Matrix<double,_6,_6,_0,_6,_6> TUL2;
  Matrix<double,_6,_6,_0,_6,_6> TuL2;
  Matrix<double,_4,_4,_0,_4,_4> Tu1;
  Matrix<double,_4,_4,_0,_4,_4> TV1;
  Matrix<double,_4,_4,_0,_4,_4> TV2;
  Matrix<double,_4,_4,_0,_4,_4> Tu2;
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_6,_6,_0,_6,_6> TUL1;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_4,_4,_0,_4,_4> sol;
  Matrix<double,_3,_3,_0,_3,_3> V2;
  Matrix<double,_3,_3,_0,_3,_3> V1;
  double local_e98;
  double dStack_e90;
  double dStack_e60;
  Scalar local_e40;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_e38;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_e20;
  Matrix<double,_4,_4,_0,_4,_4> local_e08;
  Matrix<double,_4,_4,_0,_4,_4> *local_d88;
  Matrix<double,_4,_4,_0,_4,_4> *local_d80;
  Matrix<double,_4,_4,_0,_4,_4> *local_d78;
  undefined8 local_d70;
  double local_d68;
  double dStack_d60;
  double local_d58;
  double dStack_d50;
  double local_d48;
  double dStack_d40;
  undefined1 local_d38 [104];
  double dStack_cd0;
  double local_cc8;
  double dStack_cc0;
  double local_cb8;
  double dStack_cb0;
  double local_ca8;
  double dStack_ca0;
  double local_c98;
  double dStack_c90;
  Matrix<double,_4,_1,_0,_4,_1> local_c88;
  Matrix<double,_4,_4,_1,_4,_4> local_c68;
  Matrix<double,_4,_1,_0,_4,_1> *local_be8;
  Matrix<double,_4,_4,_1,_4,_4> *local_be0;
  Matrix<double,_4,_1,_0,_4,_1> *pMStack_bd8;
  undefined8 local_bd0;
  double dStack_bc8;
  undefined8 local_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  double local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  double dStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  Matrix<double,_4,_1,_0,_4,_1> local_b48;
  double local_b28;
  Matrix<double,_4,_1,_0,_4,_1> *pMStack_b20;
  double dStack_b18;
  Matrix<double,_3,_3,_0,_3,_3> MStack_b10;
  double local_ac8;
  double dStack_ac0;
  double local_ab8;
  double dStack_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double dStack_a98;
  double local_a90;
  double dStack_a88;
  double local_a80;
  double local_a78;
  double dStack_a70;
  double local_a68;
  double dStack_a60;
  double local_a58;
  double dStack_a50;
  double local_a48;
  double dStack_a40;
  double dStack_a38;
  double local_a30;
  double dStack_a28;
  double local_a20;
  double dStack_a18;
  double local_a10;
  Matrix<double,_3,_3,_0,_3,_3> local_a08;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  double local_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  double dStack_968;
  undefined8 local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  double local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  double dStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  double local_8e8;
  double dStack_8e0;
  double local_8d8;
  undefined8 uStack_8d0;
  double local_8c8;
  double dStack_8c0;
  double local_8b8;
  undefined8 uStack_8b0;
  double local_8a8;
  double dStack_8a0;
  double local_898;
  double dStack_890;
  double local_888;
  double dStack_880;
  double local_878;
  double dStack_870;
  double local_868;
  double dStack_860;
  double local_858;
  undefined8 uStack_850;
  double local_848;
  double dStack_840;
  double local_838;
  undefined8 uStack_830;
  double local_828;
  undefined8 uStack_820;
  double local_818;
  double dStack_810;
  double local_808;
  double dStack_800;
  double local_7f8;
  double dStack_7f0;
  undefined1 local_7e8 [16];
  double local_7d8;
  double dStack_7d0;
  double local_7c8;
  double dStack_7c0;
  double local_7b8;
  double dStack_7b0;
  double local_7a8;
  double dStack_7a0;
  double local_798;
  undefined8 uStack_790;
  Matrix<double,_4,_4,_0,_4,_4> *local_788;
  double dStack_780;
  double local_778;
  double dStack_770;
  double local_768;
  double dStack_760;
  undefined1 local_758 [112];
  double local_6e8;
  double local_6e0;
  Scalar local_6d8;
  Scalar local_6d0;
  Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>
  local_6c8;
  double local_6a8;
  double dStack_6a0;
  double local_698;
  double dStack_690;
  double local_688;
  double dStack_680;
  double local_678;
  double dStack_670;
  double local_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double adStack_638 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_628;
  Matrix<double,_4,_4,_0,_4,_4> local_5a8;
  undefined1 local_528 [112];
  double local_4b8 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_4a8;
  undefined1 local_428 [16];
  double dStack_418;
  Matrix<double,_3,_3,_0,_3,_3> MStack_410;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double dStack_3b0;
  double dStack_3a8;
  double dStack_3a0;
  double dStack_398;
  double local_390;
  double dStack_388;
  double local_380;
  double local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double dStack_338;
  double local_330;
  double dStack_328;
  double local_320;
  double adStack_318 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_308;
  Matrix<double,_4,_4,_0,_4,_4> local_288;
  Matrix<double,_3,_1,_0,_3,_1> local_208;
  undefined1 local_1e8 [16];
  double local_1d8;
  Matrix<double,_3,_1,_0,_3,_1> local_1c8;
  Matrix<double,_3,_1,_0,_3,_1> local_1a8;
  Matrix<double,_3,_3,_0,_3,_3> local_190;
  Matrix<double,_4,_1,_0,_4,_1> local_148;
  Matrix<double,_4,_1,_0,_4,_1> local_128;
  Matrix<double,_3,_3,_0,_3,_3> local_100;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_b8;
  
  bVar18 = 0;
  ppVar1 = (lCPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((lCPair->
       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish == ppVar1) &&
     ((ulong)((long)(plPair->
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(plPair->
                   super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41)) {
    poVar10 = std::operator<<((ostream *)&std::cerr,
                              "Solver 1M1P requires at least 1 line and 1 plane correspondence!");
    std::endl<char,std::char_traits<char>>(poVar10);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar2 = (plPair->
           super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_c88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       *(double *)
        &(ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  local_c88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 8);
  local_c88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 0x10);
  local_c88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 0x18);
  local_b48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_b48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 8);
  local_b48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 0x10);
  local_b48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 0x18);
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[0] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[1] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[1];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[2] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[3] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[3];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[1];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[2];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[3];
  getPluckerCoord<double>(&local_e20,&local_b8);
  pMStack_b20 = &local_c88;
  local_428._8_8_ = 1.48219693752374e-323;
  MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
       = 1.97626258336499e-323;
  MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
       = (double)local_e20.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
       = 1.48219693752374e-323;
  MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
       = (double)local_e20.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = 0.0;
  dStack_3c0 = 2.96439387504748e-323;
  MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = (double)local_e20.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_428._0_8_ = pMStack_b20;
  MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = (double)pMStack_b20;
  SVar19 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)&local_b28,(scalar_sum_op<double,_double> *)&local_c68,
                      (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_428);
  if (1e-06 <= ABS(SVar19)) {
    local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_c88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
           array[0];
    local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = local_c88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
           array[1];
    local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = local_c88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
           array[2];
    local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = local_c88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
           array[3];
    local_148.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_b48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
           array[0];
    local_148.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = local_b48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
           array[1];
    local_148.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = local_b48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
           array[2];
    local_148.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = local_b48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
           array[3];
    getPredefinedTransformations1Plane3Line<double>(&local_e38,&local_128,&local_148,false);
    lVar13 = 0x10;
    pMVar14 = local_e38.
              super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    pMVar15 = &local_308;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
      [0] = (pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
            .array[0];
      pMVar14 = (pointer)((long)pMVar14 + ((ulong)bVar18 * -2 + 1) * 8);
      pMVar15 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar15 + ((ulong)bVar18 * -2 + 1) * 8);
    }
    local_e38.
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_e38.
         super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -2;
    pMVar14 = local_e38.
              super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pMVar15 = &local_4a8;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
      [0] = (pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
            .array[0];
      pMVar14 = (pointer)((long)pMVar14 + ((ulong)bVar18 * -2 + 1) * 8);
      pMVar15 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar15 + ((ulong)bVar18 * -2 + 1) * 8);
    }
    pdVar12 = &dStack_418;
    local_428._0_8_ = (Matrix<double,_4,_1,_0,_4,_1> *)0x3ff0000000000000;
    local_428._8_8_ = 0.0;
    dStack_418 = 0.0;
    MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [4] = 1.0;
    MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [5] = 0.0;
    MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    local_3c8 = 0.0;
    dStack_3c0 = 0.0;
    local_3b8 = 1.0;
    dStack_3b0 = 0.0;
    dStack_3a8 = 0.0;
    dStack_3a0 = 0.0;
    dStack_398 = 0.0;
    local_390 = 0.0;
    dStack_388 = 0.0;
    local_380 = 1.0;
    pdVar8 = &local_378;
    local_378 = 0.0;
    dStack_370 = 0.0;
    local_368 = 0.0;
    dStack_360 = 0.0;
    local_358 = 0.0;
    dStack_350 = 0.0;
    local_348 = 1.0;
    local_320 = 0.0;
    adStack_318[0] = 0.0;
    local_330 = 0.0;
    dStack_328 = 0.0;
    dStack_340 = 0.0;
    dStack_338 = 0.0;
    adStack_318[1] = 1.0;
    local_b28 = 1.0;
    pMStack_b20 = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
    dStack_b18 = 0.0;
    MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [4] = 1.0;
    MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [5] = 0.0;
    MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    local_ac8 = 0.0;
    dStack_ac0 = 0.0;
    local_ab8 = 1.0;
    dStack_ab0 = 0.0;
    dStack_aa8 = 0.0;
    dStack_aa0 = 0.0;
    dStack_a98 = 0.0;
    local_a90 = 0.0;
    dStack_a88 = 0.0;
    local_a80 = 1.0;
    pdVar17 = &local_a78;
    local_a78 = 0.0;
    dStack_a70 = 0.0;
    local_a68 = 0.0;
    dStack_a60 = 0.0;
    local_a58 = 0.0;
    dStack_a50 = 0.0;
    local_a48 = 1.0;
    local_a20 = 0.0;
    dStack_a18 = 0.0;
    local_a30 = 0.0;
    dStack_a28 = 0.0;
    dStack_a40 = 0.0;
    dStack_a38 = 0.0;
    local_a10 = 1.0;
    do {
      dVar38 = *(double *)((long)local_4b8 + lVar13 + 8);
      pdVar12[-2] = *(double *)((long)local_4b8 + lVar13);
      pdVar12[-1] = dVar38;
      *pdVar12 = *(double *)
                  ((long)local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array + lVar13);
      lVar13 = lVar13 + 0x20;
      pdVar12 = pdVar12 + 6;
    } while (lVar13 != 0x70);
    lVar11 = 8;
    do {
      pdVar8[-1] = *(double *)((long)local_4b8 + lVar11 + 8);
      dVar38 = *(double *)
                ((long)local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar11 + 8);
      *pdVar8 = *(double *)
                 ((long)local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array + lVar11);
      pdVar8[1] = dVar38;
      lVar11 = lVar11 + 0x20;
      pdVar8 = pdVar8 + 6;
    } while (lVar11 != 0x68);
    local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xc];
    local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd];
    local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xe];
    getSkew<double>(&local_a08,&local_1a8);
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&MStack_410;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6]
         = 0.0;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7]
         = 0.0;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3]
         = 1.48219693752374e-323;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4]
         = 1.48219693752374e-323;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8]
         = 1.97626258336499e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 1.48219693752374e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = 1.48219693752374e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
         = 1.48219693752374e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
         = 0.0;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
         = 2.96439387504748e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = (double)local_428;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&local_a08;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2]
         = (double)&local_4a8;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[5]
         = (double)&local_4a8;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&local_e08,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&local_c68,(assign_op<double,_double> *)&local_6c8,(type)0x0);
    lVar11 = 0x10;
    pdVar8 = &dStack_b18;
    do {
      dVar38 = *(double *)((long)adStack_318 + lVar11 + 8);
      pdVar8[-2] = *(double *)((long)adStack_318 + lVar11);
      pdVar8[-1] = dVar38;
      *pdVar8 = *(double *)
                 ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array + lVar11);
      lVar11 = lVar11 + 0x20;
      pdVar8 = pdVar8 + 6;
    } while (lVar11 != 0x70);
    lVar11 = 8;
    do {
      pdVar17[-1] = *(double *)((long)adStack_318 + lVar11 + 8);
      dVar38 = *(double *)
                ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar11 + 8);
      *pdVar17 = *(double *)
                  ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array + lVar11);
      pdVar17[1] = dVar38;
      lVar11 = lVar11 + 0x20;
      pdVar17 = pdVar17 + 6;
    } while (lVar11 != 0x68);
    local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xc];
    local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd];
    local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xe];
    getSkew<double>(&local_a08,&local_1c8);
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&MStack_b10;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6]
         = 0.0;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7]
         = 0.0;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3]
         = 1.48219693752374e-323;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4]
         = 1.48219693752374e-323;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8]
         = 1.97626258336499e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 1.48219693752374e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = 1.48219693752374e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
         = 1.48219693752374e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
         = 0.0;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
         = 2.96439387504748e-323;
    local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = (double)&local_b28;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&local_a08;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2]
         = (double)&local_308;
    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[5]
         = (double)&local_308;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&local_e08,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&local_c68,(assign_op<double,_double> *)&local_6c8,(type)0x0);
    dVar38 = ((local_e20.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
    ;
    dVar30 = ((local_e20.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
    ;
    dVar20 = ((local_e20.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
    ;
    dVar25 = ((local_e20.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
    ;
    dVar29 = ((local_e20.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
    ;
    dVar31 = ((local_e20.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
    ;
    local_d38._48_8_ =
         dStack_338 * dVar31 +
         local_368 * dVar29 +
         dStack_398 * dVar25 +
         local_3c8 * dVar20 +
         MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] * dVar30 + (double)local_428._0_8_ * dVar38;
    local_d38._56_8_ =
         local_330 * dVar31 +
         dStack_360 * dVar29 +
         local_390 * dVar25 +
         dStack_3c0 * dVar20 +
         MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] * dVar30 + (double)local_428._8_8_ * dVar38;
    local_d38._64_8_ =
         dStack_328 * dVar31 +
         local_358 * dVar29 +
         dStack_388 * dVar25 +
         local_3b8 * dVar20 +
         MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] * dVar30 + dStack_418 * dVar38;
    local_d38._72_8_ =
         local_320 * dVar31 +
         dStack_350 * dVar29 +
         local_380 * dVar25 +
         dStack_3b0 * dVar20 +
         MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] * dVar30 +
         MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] * dVar38;
    local_d38._80_8_ =
         dVar31 * adStack_318[0] +
         dVar29 * local_348 +
         dVar25 * local_378 +
         dVar20 * dStack_3a8 +
         dVar30 * MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[7] +
         dVar38 * MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1];
    dVar37 = dVar31 * adStack_318[1] +
             dVar29 * dStack_340 +
             dVar25 * dStack_370 +
             dVar20 * dStack_3a0 +
             dVar30 * MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[8] +
             dVar38 * MStack_410.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2];
    dVar38 = local_e20.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    dVar30 = local_e20.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    dVar20 = local_e20.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    dVar25 = local_e20.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    dVar29 = local_e20.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    dVar31 = local_e20.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    dVar32 = dStack_a38 * dVar31 +
             local_a68 * dVar29 +
             dStack_a98 * dVar25 +
             local_ac8 * dVar20 +
             MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3] * dVar30 + local_b28 * dVar38;
    dVar33 = local_a30 * dVar31 +
             dStack_a60 * dVar29 +
             local_a90 * dVar25 +
             dStack_ac0 * dVar20 +
             MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4] * dVar30 + (double)pMStack_b20 * dVar38;
    dVar34 = dStack_a28 * dVar31 +
             local_a58 * dVar29 +
             dStack_a88 * dVar25 +
             local_ab8 * dVar20 +
             MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5] * dVar30 + dStack_b18 * dVar38;
    dStack_ca0 = local_a20 * dVar31 +
                 dStack_a50 * dVar29 +
                 local_a80 * dVar25 +
                 dStack_ab0 * dVar20 +
                 MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6] * dVar30 +
                 MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] * dVar38;
    local_c98 = dVar31 * dStack_a18 +
                dVar29 * local_a48 +
                dVar25 * local_a78 +
                dVar20 * dStack_aa8 +
                dVar30 * MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[7] +
                dVar38 * MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[1];
    dVar38 = dVar31 * local_a10 +
             dVar29 * dStack_a40 +
             dVar25 * dStack_a70 +
             dVar20 * dStack_aa0 +
             dVar30 * MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[8] +
             dVar38 * MStack_b10.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2];
    local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = (double)&local_c88;
    local_d38._88_8_ = dVar37;
    local_cb8 = dVar32;
    dStack_cb0 = dVar33;
    local_ca8 = dVar34;
    dStack_c90 = dVar38;
    local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)&local_4a8;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_c68,(SrcXprType *)&local_a08,(assign_op<double,_double> *)&local_e08);
    local_be8 = (Matrix<double,_4,_1,_0,_4,_1> *)
                local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
    pMStack_bd8 = (Matrix<double,_4,_1,_0,_4,_1> *)
                  local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1];
    local_bd0 = 4;
    local_be0 = &local_c68;
    if (((ulong)local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] & 0xf) == 0) {
      dVar30 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1])->m_storage).m_data.array[2];
      dVar20 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1])->m_storage).m_data.array[3];
      local_d38._0_8_ =
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[3] * dVar20 +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[1] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[1] +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[2] * dVar30 +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[0];
      local_d38._8_8_ =
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[7] * dVar20 +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[5] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[1] +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[6] * dVar30 +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[4] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[0];
      local_d38._16_8_ =
           dVar20 * local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xb] +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[9] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[1] +
           dVar30 * local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[10] +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[8] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[0];
      local_d38._24_8_ =
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0xf] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[3] +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0xd] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[1] +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0xe] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[2] +
           local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0xc] *
           (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1])->m_storage).m_data.array[0];
      local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = (double)&local_b48;
      local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)&local_308;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_c68,(SrcXprType *)&local_a08,(assign_op<double,_double> *)&local_e08);
      local_be8 = (Matrix<double,_4,_1,_0,_4,_1> *)
                  local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1];
      pMStack_bd8 = (Matrix<double,_4,_1,_0,_4,_1> *)
                    local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1];
      local_bd0 = 4;
      local_be0 = &local_c68;
      if (((ulong)local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1] & 0xf) == 0) {
        dVar30 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                  local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1])->m_storage).m_data.array[2];
        dVar20 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                  local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1])->m_storage).m_data.array[3];
        local_d38._96_8_ =
             local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[3] * dVar20 +
             local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[1] *
             (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1])->m_storage).m_data.array[1] +
             local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[2] * dVar30 +
             local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[0] *
             (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1])->m_storage).m_data.array[0];
        dStack_cd0 = local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[7] * dVar20 +
                     local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[5] *
                     (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                      local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1])->m_storage).m_data.array[1] +
                     local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[6] * dVar30 +
                     local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[4] *
                     (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                      local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1])->m_storage).m_data.array[0];
        local_cc8 = dVar20 * local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                             m_storage.m_data.array[0xb] +
                    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[9] *
                    (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                     local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1])->m_storage).m_data.array[1] +
                    dVar30 * local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                             m_storage.m_data.array[10] +
                    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[8] *
                    (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                     local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1])->m_storage).m_data.array[0];
        dStack_cc0 = local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xf] *
                     (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                      local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1])->m_storage).m_data.array[3] +
                     local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xd] *
                     (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                      local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1])->m_storage).m_data.array[1] +
                     local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xe] *
                     (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                      local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1])->m_storage).m_data.array[2] +
                     local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xc] *
                     (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                      local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1])->m_storage).m_data.array[0];
        dVar30 = (double)local_d38._16_8_ * (double)local_d38._64_8_ +
                 (double)local_d38._8_8_ * (double)local_d38._56_8_ +
                 (double)local_d38._0_8_ * (double)local_d38._48_8_;
        auVar39._0_8_ =
             (dVar37 * (double)local_d38._8_8_ - (double)local_d38._80_8_ * (double)local_d38._16_8_
             ) - (double)local_d38._24_8_ * (double)local_d38._48_8_;
        auVar39._8_8_ =
             ((double)local_d38._16_8_ * (double)local_d38._72_8_ - dVar37 * (double)local_d38._0_8_
             ) - (double)local_d38._24_8_ * (double)local_d38._56_8_;
        local_6e8 = (((double)local_d38._80_8_ * (double)local_d38._0_8_ -
                     (double)local_d38._8_8_ * (double)local_d38._72_8_) -
                    (double)local_d38._64_8_ * (double)local_d38._24_8_) / dVar30;
        auVar36._8_8_ = dVar30;
        auVar36._0_8_ = dVar30;
        local_758._96_16_ = divpd(auVar39,auVar36);
        auVar26._0_8_ = local_cc8 * dVar34 + dStack_cd0 * dVar33 + (double)local_d38._96_8_ * dVar32
        ;
        auVar35._0_8_ = (dVar38 * dStack_cd0 - local_c98 * local_cc8) - dStack_cc0 * dVar32;
        auVar35._8_8_ =
             (local_cc8 * dStack_ca0 - dVar38 * (double)local_d38._96_8_) - dStack_cc0 * dVar33;
        dVar38 = ((local_c98 * (double)local_d38._96_8_ - dStack_cd0 * dStack_ca0) -
                 dStack_cc0 * dVar34) / auVar26._0_8_;
        auVar26._8_8_ = auVar26._0_8_;
        auVar36 = divpd(auVar35,auVar26);
        local_758._0_8_ = 1.0;
        local_758._8_8_ = 0.0;
        local_758._16_8_ = 0.0;
        local_758._24_8_ = 0.0;
        local_758._32_8_ = 0.0;
        local_758._40_8_ = 1.0;
        local_758._48_8_ = 0.0;
        local_758._56_8_ = 0.0;
        local_758._64_8_ = 0.0;
        local_758._72_8_ = 0.0;
        local_528._0_8_ = 1.0;
        local_528._8_8_ = 0.0;
        local_528._16_8_ = 0.0;
        local_528._24_8_ = 0.0;
        local_528._32_8_ = 0.0;
        local_528._40_8_ = 1.0;
        local_528._48_8_ = 0.0;
        local_528._56_8_ = 0.0;
        local_528._64_8_ = 0.0;
        local_528._72_8_ = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[0] = 1.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[1] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[2] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[3] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[5] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[6] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[7] = 1.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[8] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[9] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[10] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[0xb] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[0xd] = 0.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[0xe] = 1.0;
        local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[0xf] = 0.0;
        local_be8 = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
        local_be0 = (Matrix<double,_4,_4,_1,_4,_4> *)0x0;
        pMStack_bd8 = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
        local_bd0 = 0;
        dStack_bc8 = 0.0;
        local_bc0 = 0x3ff0000000000000;
        local_bb8 = 0;
        uStack_bb0 = 0;
        local_ba8 = 0;
        uStack_ba0 = 0;
        local_b98 = 0.0;
        uStack_b90 = 0;
        local_b88 = 0x3ff0000000000000;
        local_b60 = 0;
        uStack_b58 = 0;
        local_b70 = 0;
        dStack_b68 = 0.0;
        local_b80 = 0;
        uStack_b78 = 0;
        local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = 1.0;
        local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = 0.0;
        local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = 0.0;
        local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = 0.0;
        local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = 0.0;
        local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = 0.0;
        local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = 0.0;
        local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] = 1.0;
        local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = 0.0;
        uStack_9c0 = 0;
        local_9b8 = 0;
        uStack_9b0 = 0;
        local_9a8 = 0;
        uStack_9a0 = 0;
        local_998 = 1.0;
        uStack_990 = 0;
        uStack_988 = 0;
        local_980 = 0;
        uStack_978 = 0;
        local_970 = 0;
        dStack_968 = 0.0;
        local_960 = 0x3ff0000000000000;
        local_958 = 0;
        uStack_950 = 0;
        local_948 = 0;
        uStack_940 = 0;
        local_938 = 0.0;
        uStack_930 = 0;
        local_928 = 0x3ff0000000000000;
        local_900 = 0;
        uStack_8f8 = 0;
        local_910 = 0;
        dStack_908 = 0.0;
        local_920 = 0;
        uStack_918 = 0;
        local_758._80_8_ = 1.0;
        local_758._88_8_ = 0.0;
        local_6e0 = 1.0;
        local_528._80_8_ = 1.0;
        local_528._88_8_ = 0.0;
        local_4b8[1] = 1.0;
        local_b50 = 0x3ff0000000000000;
        local_8f0 = 0x3ff0000000000000;
        local_528._96_16_ = auVar36;
        local_4b8[0] = dVar38;
        local_1e8 = local_758._96_16_;
        local_1d8 = local_6e8;
        getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&local_e08,
                        (Matrix<double,_3,_1,_0,_3,_1> *)local_1e8);
        lVar11 = 0x10;
        do {
          *(ulong *)((long)local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array + lVar11 * 2 + -8) =
               *(ulong *)((long)local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array + lVar11 + -0x10) ^ 0x8000000000000000;
          uVar4 = *(ulong *)((long)local_e08.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array + lVar11);
          *(ulong *)((long)local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array + lVar11 * 2) =
               *(ulong *)((long)local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array + lVar11 + -8) ^ 0x8000000000000000;
          *(ulong *)((long)local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array + lVar11 * 2 + 8) = uVar4 ^ 0x8000000000000000;
          lVar11 = lVar11 + 0x18;
        } while (lVar11 != 0x58);
        local_e98 = auVar36._0_8_;
        dStack_e90 = auVar36._8_8_;
        local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_e98;
        local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = dStack_e90;
        local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = dVar38;
        getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&local_e08,&local_208);
        dVar30 = local_b98;
        dVar38 = dStack_bc8;
        uVar7 = local_d38._88_8_;
        uVar6 = local_d38._80_8_;
        uVar5 = local_d38._48_8_;
        lVar11 = 0x10;
        do {
          *(ulong *)((long)&local_a10 + lVar11 * 2) =
               *(ulong *)((long)local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array + lVar11 + -0x10) ^ 0x8000000000000000;
          uVar4 = *(ulong *)((long)local_e08.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array + lVar11);
          *(ulong *)((long)local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array + lVar11 * 2) =
               *(ulong *)((long)local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array + lVar11 + -8) ^ 0x8000000000000000;
          *(ulong *)((long)local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array + lVar11 * 2 + 8) = uVar4 ^ 0x8000000000000000;
          lVar11 = lVar11 + 0x18;
        } while (lVar11 != 0x58);
        local_7a8 = (double)local_d38._48_8_ *
                    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0];
        dStack_7a0 = (double)local_d38._48_8_ *
                     local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[1];
        local_d48 = (double)local_d38._56_8_;
        dStack_d40 = (double)local_d38._64_8_;
        local_7b8 = (double)local_d38._56_8_ *
                    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[6];
        dStack_7b0 = (double)local_d38._56_8_ *
                     local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[7];
        local_768 = (double)local_d38._64_8_;
        dStack_760 = (double)local_d38._72_8_;
        local_d58 = (double)local_d38._72_8_;
        dStack_d50 = (double)local_d38._80_8_;
        local_788 = (Matrix<double,_4,_4,_0,_4,_4> *)
                    local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[2];
        dStack_780 = local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[3];
        local_778 = local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[8];
        dStack_770 = local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[9];
        local_d68 = local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xe];
        dStack_d60 = local_c68.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xf];
        local_888 = local_cb8;
        dStack_880 = dStack_cb0;
        local_878 = local_cb8 *
                    local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0];
        dStack_870 = local_cb8 *
                     local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1];
        local_868 = dStack_cb0;
        dStack_860 = local_ca8;
        local_8a8 = dStack_cb0 *
                    local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[6];
        dStack_8a0 = dStack_cb0 *
                     local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[7];
        local_6c8.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)local_758;
        local_6c8.m_lhs.m_lhs.m_rhs.m_xpr = (XprTypeNested)local_d38;
        local_798 = dStack_b68;
        uStack_790 = local_b60;
        local_8c8 = local_ca8;
        dStack_8c0 = dStack_ca0;
        local_898 = dStack_ca0;
        dStack_890 = local_c98;
        local_848 = local_c98;
        dStack_840 = dStack_c90;
        local_8e8 = local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[2];
        dStack_8e0 = local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[3];
        local_8d8 = local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[8];
        uStack_8d0 = uStack_9c0;
        local_8b8 = local_998;
        uStack_8b0 = uStack_990;
        local_858 = dStack_968;
        uStack_850 = local_960;
        local_828 = local_938;
        uStack_820 = uStack_930;
        local_838 = dStack_908;
        uStack_830 = local_900;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,_4,_4,_1,_4,_4> *)&local_e08,(SrcXprType *)&local_6c8,
              (assign_op<double,_double> *)&local_628);
        local_d88 = local_6c8.m_lhs.m_lhs.m_rhs.m_xpr;
        local_d78 = local_6c8.m_lhs.m_lhs.m_rhs.m_xpr;
        local_d70 = 4;
        local_d80 = &local_e08;
        if (((ulong)local_6c8.m_lhs.m_lhs.m_rhs.m_xpr & 0xf) == 0) {
          local_7d8 = ((local_6c8.m_lhs.m_lhs.m_rhs.m_xpr)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array[0];
          dStack_7d0 = ((local_6c8.m_lhs.m_lhs.m_rhs.m_xpr)->
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                       m_data.array[1];
          dVar20 = ((local_6c8.m_lhs.m_lhs.m_rhs.m_xpr)->
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array[2];
          dVar25 = ((local_6c8.m_lhs.m_lhs.m_rhs.m_xpr)->
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array[3];
          local_7f8 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0] * local_7d8;
          dStack_7f0 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[1] * dStack_7d0;
          local_808 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2] * dVar20;
          dStack_800 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[3] * dVar25;
          local_7c8 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[4] * local_7d8;
          dStack_7c0 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[5] * dStack_7d0;
          local_7d8 = local_7d8 *
                      local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[8];
          dStack_7d0 = dStack_7d0 *
                       local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9];
          local_818 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[6] * dVar20;
          dStack_810 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[7] * dVar25;
          local_7e8._8_4_ =
               SUB84(dVar25 * local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                              .m_storage.m_data.array[0xb],0);
          local_7e8._0_8_ =
               dVar20 * local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[10];
          local_7e8._12_4_ =
               (int)((ulong)(dVar25 * local_e08.
                                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                      m_storage.m_data.array[0xb]) >> 0x20);
          local_6c8.m_lhs.m_lhs.m_rhs.m_xpr = (XprTypeNested)(local_d38 + 0x60);
          local_6c8.m_lhs.m_lhs.m_lhs.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)local_528;
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<double,_4,_4,_1,_4,_4> *)&local_e08,(SrcXprType *)&local_6c8,
                (assign_op<double,_double> *)&local_628);
          local_d88 = local_6c8.m_lhs.m_lhs.m_rhs.m_xpr;
          local_d78 = local_6c8.m_lhs.m_lhs.m_rhs.m_xpr;
          local_d70 = 4;
          local_d80 = &local_e08;
          if (((ulong)local_6c8.m_lhs.m_lhs.m_rhs.m_xpr & 0xf) == 0) {
            dVar20 = (double)uVar6 * 0.0;
            dVar25 = (double)uVar7 * 0.0 +
                     dVar20 + local_d58 * 0.0 + local_768 * 0.0 + local_7a8 + local_7b8;
            dVar29 = (double)uVar7 * 0.0 +
                     dVar20 + local_d58 * 0.0 + local_768 * 0.0 + dStack_7a0 + dStack_7b0;
            dVar32 = dStack_7f0 + dStack_800 + local_7f8 + local_808;
            dVar33 = dStack_7c0 + dStack_810 + local_7c8 + local_818;
            dVar20 = dStack_7d0 + (double)local_7e8._8_8_ + local_7d8 + (double)local_7e8._0_8_;
            dVar31 = local_798 * (double)uVar7 +
                     dVar38 * local_d58 +
                     local_d68 * local_768 +
                     local_d48 * local_778 + (double)uVar5 * (double)local_788 +
                     dVar30 * (double)uVar6;
            dVar38 = dVar20 * dVar31 + dVar29 * dVar33 + dVar25 * dVar32;
            auVar27._0_8_ = dVar25 - dVar38 * dVar32;
            auVar27._8_8_ = dVar29 - dVar38 * dVar33;
            dVar31 = dVar31 - dVar20 * dVar38;
            dVar30 = ((local_6c8.m_lhs.m_lhs.m_rhs.m_xpr)->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[0];
            dVar20 = ((local_6c8.m_lhs.m_lhs.m_rhs.m_xpr)->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[1];
            dVar29 = dVar31 * dVar31 + auVar27._8_8_ * auVar27._8_8_ + auVar27._0_8_ * auVar27._0_8_
            ;
            dVar38 = ((local_6c8.m_lhs.m_lhs.m_rhs.m_xpr)->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[2];
            dVar25 = ((local_6c8.m_lhs.m_lhs.m_rhs.m_xpr)->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[3];
            if (0.0 < dVar29) {
              auVar21._8_8_ = 0;
              auVar21._0_8_ = dVar29;
              auVar36 = sqrtpd(auVar21,auVar21);
              auVar22._0_8_ = auVar36._0_8_;
              auVar22._8_8_ = auVar22._0_8_;
              auVar27 = divpd(auVar27,auVar22);
            }
            local_d48 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0] * dVar30;
            dStack_d40 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[1] * dVar20;
            local_d58 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2] * dVar38;
            dStack_d50 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[3] * dVar25;
            dVar29 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[4] * dVar30;
            dVar31 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[5] * dVar20;
            local_d68 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[6] * dVar38;
            dStack_d60 = local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[7] * dVar25;
            dVar30 = dVar30 * local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                              .m_storage.m_data.array[8];
            dVar20 = dVar20 * local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                              .m_storage.m_data.array[9];
            dVar38 = dVar38 * local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                              .m_storage.m_data.array[10];
            auVar3._8_4_ = SUB84(dVar25 * local_e08.
                                          super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                                          .m_storage.m_data.array[0xb],0);
            auVar3._0_8_ = dVar38;
            auVar3._12_4_ =
                 (int)((ulong)(dVar25 * local_e08.
                                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                                        .m_storage.m_data.array[0xb]) >> 0x20);
            dVar25 = atan2(auVar27._8_8_,auVar27._0_8_);
            local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] = cos(dVar25);
            local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] = (double)&local_100;
            local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1] = 0.0;
            local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2] = 4.94065645841247e-324;
            local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[3] = 4.94065645841247e-324;
            local_6c8.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)sin(dVar25);
            pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                &local_e08,(Scalar *)&local_6c8);
            local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] = 0.0;
            pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar9,(Scalar *)&local_628);
            local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] = sin(dVar25);
            local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] = -local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0];
            pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar9,(Scalar *)&local_5a8);
            local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] = cos(dVar25);
            pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar9,(Scalar *)&local_288);
            local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] = 0.0;
            pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar9,(Scalar *)&local_190);
            local_e40 = 0.0;
            pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar9,&local_e40);
            local_d38._40_8_ = 0.0;
            pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar9,(Scalar *)(local_d38 + 0x28));
            local_d38._32_8_ = 1.0;
            Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar9,(Scalar *)(local_d38 + 0x20));
            if (((long)local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[3] +
                 (long)local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[1] == 3) &&
               (local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[2] == 1.48219693752374e-323)) {
              dStack_e60 = auVar3._8_8_;
              dVar32 = dStack_840 * 0.0 +
                       local_848 * 0.0 + local_898 * 0.0 + local_8c8 * 0.0 + local_878 + local_8a8;
              dVar33 = dStack_840 * 0.0 +
                       local_848 * 0.0 + local_898 * 0.0 + local_8c8 * 0.0 + dStack_870 + dStack_8a0
              ;
              dVar34 = dStack_d40 + dStack_d50 + local_d48 + local_d58;
              dVar29 = dVar31 + dStack_d60 + dVar29 + local_d68;
              dVar25 = dStack_840 * local_838 +
                       local_828 * local_848 +
                       local_858 * local_898 +
                       local_8b8 * local_8c8 + local_868 * local_8d8 + local_888 * local_8e8;
              dVar38 = dVar20 + dStack_e60 + dVar30 + dVar38;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] = 1.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[1] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[2] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[3] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[4] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[5] = 1.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[6] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[7] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[8] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[9] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[10] = 1.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xb] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xc] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xd] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xe] = 0.0;
              local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xf] = 1.0;
              lVar11 = 0x10;
              pdVar8 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + 2;
              do {
                dVar30 = pdVar8[-1];
                *(double *)((long)adStack_638 + lVar11) =
                     ((plain_array<double,_9,_0,_0> *)(pdVar8 + -2))->array[0];
                *(double *)((long)adStack_638 + lVar11 + 8) = dVar30;
                *(double *)
                 ((long)local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array + lVar11) = *pdVar8;
                pdVar8 = pdVar8 + 3;
                lVar11 = lVar11 + 0x20;
              } while (lVar11 != 0x70);
              dVar30 = dVar25 * dVar38 + dVar33 * dVar29 + dVar32 * dVar34;
              auVar28._0_8_ = dVar32 - dVar30 * dVar34;
              auVar28._8_8_ = dVar33 - dVar30 * dVar29;
              dVar25 = dVar25 - dVar38 * dVar30;
              auVar23._0_8_ =
                   dVar25 * dVar25 + auVar28._8_8_ * auVar28._8_8_ + auVar28._0_8_ * auVar28._0_8_;
              if (0.0 < auVar23._0_8_) {
                auVar23._8_8_ = 0;
                auVar36 = sqrtpd(auVar23,auVar23);
                auVar24._0_8_ = auVar36._0_8_;
                auVar24._8_8_ = auVar24._0_8_;
                auVar28 = divpd(auVar28,auVar24);
              }
              dVar38 = atan2(auVar28._8_8_,auVar28._0_8_);
              local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] = cos(dVar38);
              local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[1] = 0.0;
              local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[2] = 4.94065645841247e-324;
              local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[3] = 4.94065645841247e-324;
              local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] = (double)&local_190;
              local_6c8.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)sin(dVar38);
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                  &local_e08,(Scalar *)&local_6c8);
              local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] = 0.0;
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar9,(Scalar *)&local_5a8);
              local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] = sin(dVar38);
              local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] =
                   -local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0];
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar9,(Scalar *)&local_288);
              local_e40 = cos(dVar38);
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar9,&local_e40);
              local_d38._40_8_ = 0.0;
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar9,(Scalar *)(local_d38 + 0x28));
              local_d38._32_8_ = 0.0;
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar9,(Scalar *)(local_d38 + 0x20));
              local_6d0 = 0.0;
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar9,&local_6d0);
              local_6d8 = 1.0;
              Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar9,&local_6d8);
              if (((long)local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[3] +
                   (long)local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[1] == 3) &&
                 (local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[2] == 1.48219693752374e-323)) {
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0] = 1.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[2] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[3] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[4] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[5] = 1.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[6] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[7] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[8] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[9] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[10] = 1.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xb] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xc] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xe] = 0.0;
                local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xf] = 1.0;
                lVar11 = 0x10;
                pdVar8 = local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + 2;
                do {
                  dVar38 = pdVar8[-1];
                  *(double *)
                   ((long)local_628.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar11 + 0x70) =
                       ((plain_array<double,_9,_0,_0> *)(pdVar8 + -2))->array[0];
                  *(double *)
                   ((long)local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar11 + -8) = dVar38;
                  *(double *)
                   ((long)local_5a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar11) = *pdVar8;
                  pdVar8 = pdVar8 + 3;
                  lVar11 = lVar11 + 0x20;
                } while (lVar11 != 0x70);
                local_6c8.m_lhs.m_lhs.m_lhs.m_xpr = &local_308;
                local_6c8.m_lhs.m_lhs.m_rhs.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)local_528;
                local_6c8.m_lhs.m_rhs.m_xpr = &local_5a8;
                local_6c8.m_rhs = &local_628;
                Eigen::internal::
                call_dense_assignment_loop<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,4,0,4,4>,1>,Eigen::internal::assign_op<double,double>>
                          (&local_e08,&local_6c8,(assign_op<double,_double> *)&local_e40);
                lVar11 = 0;
                do {
                  dVar38 = *(double *)(local_758 + lVar11);
                  dVar30 = *(double *)(local_758 + lVar11 + 8);
                  dVar20 = *(double *)(local_758 + lVar11 + 0x10);
                  dVar25 = *(double *)(local_758 + lVar11 + 0x18);
                  *(double *)((long)&local_6c8.m_lhs.m_lhs.m_lhs.m_xpr + lVar11) =
                       local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xc] * dVar25 +
                       local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[8] * dVar20 +
                       local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[4] * dVar30 +
                       local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0] * dVar38;
                  *(double *)((long)&local_6c8.m_lhs.m_lhs.m_rhs.m_xpr + lVar11) =
                       local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xd] * dVar25 +
                       local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9] * dVar20 +
                       local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[5] * dVar30 +
                       local_e08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[1] * dVar38;
                  *(double *)((long)&local_6c8.m_lhs.m_rhs.m_xpr + lVar11) =
                       dVar25 * local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xe] +
                       dVar20 * local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[10] +
                       dVar30 * local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] +
                       dVar38 * local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[2];
                  *(double *)((long)&local_6c8.m_rhs + lVar11) =
                       dVar25 * local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xf] +
                       dVar20 * local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xb] +
                       dVar30 * local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] +
                       dVar38 * local_e08.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[3];
                  lVar11 = lVar11 + 0x20;
                } while (lVar11 != 0x80);
                lVar11 = 0;
                do {
                  dVar38 = *(double *)
                            ((long)local_4a8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array + lVar11);
                  dVar30 = *(double *)
                            ((long)local_4a8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array + lVar11 + 8);
                  dVar20 = *(double *)
                            ((long)local_4a8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array + lVar11 + 0x10);
                  dVar25 = *(double *)
                            ((long)local_4a8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array + lVar11 + 0x18);
                  *(double *)
                   ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar11) =
                       local_668 * dVar25 +
                       local_688 * dVar20 +
                       local_6a8 * dVar30 + (double)local_6c8.m_lhs.m_lhs.m_lhs.m_xpr * dVar38;
                  *(double *)
                   ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar11 + 8) =
                       dStack_660 * dVar25 +
                       dStack_680 * dVar20 +
                       dStack_6a0 * dVar30 + (double)local_6c8.m_lhs.m_lhs.m_rhs.m_xpr * dVar38;
                  *(double *)
                   ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar11 + 0x10) =
                       dVar25 * local_658 +
                       dVar20 * local_678 +
                       dVar30 * local_698 + dVar38 * (double)local_6c8.m_lhs.m_rhs.m_xpr;
                  *(double *)
                   ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar11 + 0x18) =
                       dVar25 * dStack_650 +
                       dVar20 * dStack_670 + dVar30 * dStack_690 + dVar38 * (double)local_6c8.m_rhs;
                  lVar11 = lVar11 + 0x20;
                } while (lVar11 != 0x80);
                __position._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                  ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                            ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                              *)__return_storage_ptr__,__position,&local_288);
                }
                else {
                  pMVar15 = &local_288;
                  iVar16._M_current = __position._M_current;
                  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
                    ((iVar16._M_current)->
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                    array[0] = (pMVar15->
                               super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                               m_storage.m_data.array[0];
                    pMVar15 = (Matrix<double,_4,_4,_0,_4,_4> *)
                              ((long)pMVar15 + ((ulong)bVar18 * -2 + 1) * 8);
                    iVar16._M_current =
                         (Matrix<double,_4,_4,_0,_4,_4> *)
                         ((long)iVar16._M_current + ((ulong)bVar18 * -2 + 1) * 8);
                  }
                  (__return_storage_ptr__->
                  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
                if (local_e38.
                    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_e38.
                                  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_e38.
                                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_e38.
                                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_001ac4e5;
              }
            }
            __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                          ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                          "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                         );
          }
        }
      }
    }
    __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                  "Eigen::internal::block_evaluator<const Eigen::Matrix<double, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<double, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
                 );
  }
LAB_001ac4e5:
  if (local_e20.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e20.
                    super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e20.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e20.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){

	// check input vectors size
	if(lCPair.size() < 1 && plPair.size() < 2){
		std::cerr << "Solver 1M1P requires at least 1 line and 1 plane correspondence!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;
	out.clear();

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu;
	Pi = plPair[0].first; Nu = plPair[0].second;
	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);

	// check if line and plane are parallel
	if(abs(Pi.head(3).dot(lines1[0].head(3))) < 1e-6){
		// std::cout << Pi.head(3).transpose() << "   " << lines1[0].head(3).transpose() << std::endl; 
		// std::cout << lCPair[0].first.second.head(3).transpose() << "  " << lCPair[0].first.first.head(3).transpose() << std::endl;
		// std::cerr << "Solver 1M1P: The line and plane cannot be parallel!" << std::endl;
		return out;
		// exit(-1);
	}

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TU2 = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU1 = predTrans.back();
	predTrans.pop_back();

	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,4,1> PiU = TU1.transpose().inverse()*Pi;
	Eigen::Matrix<floatPrec,4,1> NuU = TU2.transpose().inverse()*Nu;
	
	// get direction and moment vectors
	Eigen::Matrix<floatPrec,3,1> dir1 = lU1.head(3), m1 = lU1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lU2.head(3), m2 = lU2.tail(3);
	Eigen::Matrix<floatPrec,3,1> n1 = PiU.head(3), n2 = NuU.head(3);

	// compute intersection line with plane
	Eigen::Matrix<floatPrec,3,1> p1 = (n1.cross(m1) - PiU(3)*dir1)/(n1.dot(dir1));
	Eigen::Matrix<floatPrec,3,1> p2 = (n2.cross(m2) - NuU(3)*dir2)/(n2.dot(dir2));

	Matrix<floatPrec, 4, 4> Tu1 = Matrix<floatPrec, 4, 4>::Identity();
	Tu1.topRightCorner(3,1) = p1;
	Matrix<floatPrec, 4, 4> Tu2 = Matrix<floatPrec, 4, 4>::Identity();
	Tu2.topRightCorner(3,1) = p2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(p1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(p2);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*lU1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*lU2;
	Eigen::Matrix<floatPrec,4,1> Piu = Tu1.transpose().inverse()*PiU;
	Eigen::Matrix<floatPrec,4,1> Nuu = Tu2.transpose().inverse()*NuU;

	// align x axis wiht projection of line direction to plane
	// project line direction to plane
	dir1 = lu1.head(3); m1 = lu1.tail(3);
	dir2 = lu2.head(3); m2 = lu2.tail(3);
	n1 = Piu.head(3); n2 = Nuu.head(3);
	// frame A
	Eigen::Matrix<floatPrec,3,1> w = (dir1 - dir1.dot(n1)*n1).normalized();
	floatPrec alpha1 = atan2(w(1),w(0));
	Eigen::Matrix<floatPrec,3,3> V1;
	V1 << cos(alpha1),sin(alpha1),0,-sin(alpha1),cos(alpha1),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV1.topLeftCorner(3,3) = V1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> w2 = (dir2 - dir2.dot(n2)*n2).normalized();
	floatPrec alpha2 = atan2(w2(1),w2(0));
	Eigen::Matrix<floatPrec,3,3> V2;
	V2 << cos(alpha2),sin(alpha2),0,-sin(alpha2),cos(alpha2),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV2.topLeftCorner(3,3) = V2;

	Eigen::Matrix<floatPrec,4,4> sol = TU2.inverse()*Tu2.inverse()*TV2.inverse()*TV1*Tu1*TU1;
	out.push_back(sol);

	return out;
}